

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::UpdateStats
               (BitpackingCompressionState<unsigned_short,_true,_short> *state,idx_t count)

{
  pointer pCVar1;
  BaseStatistics *in_RSI;
  long in_RDI;
  unsigned_short new_value;
  BaseStatistics *this;
  
  this = in_RSI;
  pCVar1 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_RSI);
  ::std::__atomic_base<unsigned_long>::operator+=
            (&(pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>,(__int_type)in_RSI);
  if ((*(byte *)(in_RDI + 0x2887) & 1) == 0) {
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)this);
    new_value = (unsigned_short)((ulong)in_RSI >> 0x30);
    BaseStatistics::UpdateNumericStats<unsigned_short>(this,new_value);
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)this);
    BaseStatistics::UpdateNumericStats<unsigned_short>(this,new_value);
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}